

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O0

u32 choose_min_match_len(u32 num_used_literals,u32 max_search_depth)

{
  uint local_1c;
  uint local_18;
  uint local_14;
  u32 min_len;
  u32 max_search_depth_local;
  u32 num_used_literals_local;
  u32 local_4;
  
  if (num_used_literals < 0x50) {
    local_1c = (uint)"\t\t\t\t\t\t\b\b\a\a\x06\x06\x06\x06\x06\x06\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04"
                     [num_used_literals];
    min_len = local_1c;
    if (max_search_depth < 0x10) {
      if (max_search_depth < 5) {
        local_14 = local_1c;
        if (4 < local_1c) {
          local_14 = 4;
        }
        min_len = local_14;
      }
      else if (max_search_depth < 10) {
        local_18 = local_1c;
        if (5 < local_1c) {
          local_18 = 5;
        }
        min_len = local_18;
      }
      else {
        if (7 < local_1c) {
          local_1c = 7;
        }
        min_len = local_1c;
      }
    }
    local_4 = min_len;
  }
  else {
    local_4 = 3;
  }
  return local_4;
}

Assistant:

static u32
choose_min_match_len(u32 num_used_literals, u32 max_search_depth)
{
	/* map from num_used_literals to min_len */
	static const u8 min_lens[] = {
		9, 9, 9, 9, 9, 9, 8, 8, 7, 7, 6, 6, 6, 6, 6, 6,
		5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5,
		5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 4, 4, 4,
		4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4,
		4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4,
		/* The rest is implicitly 3. */
	};
	u32 min_len;

	STATIC_ASSERT(DEFLATE_MIN_MATCH_LEN <= 3);
	STATIC_ASSERT(ARRAY_LEN(min_lens) <= DEFLATE_NUM_LITERALS + 1);

	if (num_used_literals >= ARRAY_LEN(min_lens))
		return 3;
	min_len = min_lens[num_used_literals];
	/*
	 * With a low max_search_depth, it may be too hard to find long matches.
	 */
	if (max_search_depth < 16) {
		if (max_search_depth < 5)
			min_len = MIN(min_len, 4);
		else if (max_search_depth < 10)
			min_len = MIN(min_len, 5);
		else
			min_len = MIN(min_len, 7);
	}
	return min_len;
}